

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_auth_decrypt
              (mbedtls_ccm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  byte bVar1;
  byte local_69;
  int diff;
  uchar i;
  uchar check_tag [16];
  int ret;
  size_t add_len_local;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  mbedtls_ccm_context *ctx_local;
  
  ctx_local._4_4_ =
       ccm_auth_crypt(ctx,1,length,iv,iv_len,add,add_len,input,output,(uchar *)&diff,tag_len);
  check_tag[0xc] = (char)ctx_local._4_4_;
  check_tag[0xd] = (char)((uint)ctx_local._4_4_ >> 8);
  check_tag[0xe] = (char)((uint)ctx_local._4_4_ >> 0x10);
  check_tag[0xf] = (char)((uint)ctx_local._4_4_ >> 0x18);
  if (ctx_local._4_4_ == 0) {
    bVar1 = 0;
    for (local_69 = 0; local_69 < tag_len; local_69 = local_69 + 1) {
      bVar1 = tag[local_69] ^ *(byte *)((long)&diff + (ulong)local_69) | bVar1;
    }
    if (bVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_zeroize(output,length);
      ctx_local._4_4_ = -0xf;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ccm_auth_decrypt( mbedtls_ccm_context *ctx, size_t length,
                      const unsigned char *iv, size_t iv_len,
                      const unsigned char *add, size_t add_len,
                      const unsigned char *input, unsigned char *output,
                      const unsigned char *tag, size_t tag_len )
{
    int ret;
    unsigned char check_tag[16];
    unsigned char i;
    int diff;

    if( ( ret = ccm_auth_crypt( ctx, CCM_DECRYPT, length,
                                iv, iv_len, add, add_len,
                                input, output, check_tag, tag_len ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < tag_len; i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_zeroize( output, length );
        return( MBEDTLS_ERR_CCM_AUTH_FAILED );
    }

    return( 0 );
}